

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_guard.hpp
# Opt level: O1

void __thiscall
sg::detail::scope_guard<std::function<void_()>,_void>::~scope_guard
          (scope_guard<std::function<void_()>,_void> *this)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  
  if (this->m_active == true) {
    if ((this->m_callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    (*(this->m_callback)._M_invoker)((_Any_data *)this);
  }
  p_Var1 = (this->m_callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

sg::detail::scope_guard<Callback>::scope_guard::~scope_guard() noexcept  /*
need the extra injected-class-name here to make different compilers happy */
{
  if(m_active)
    m_callback();
}